

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O0

int Llb_NonlinNextPartitions(Llb_Mgr_t *p,Llb_Prt_t **ppPart1,Llb_Prt_t **ppPart2)

{
  Llb_Prt_t *pLVar1;
  int iVar2;
  Llb_Prt_t *pLVar3;
  Llb_Prt_t *pLVar4;
  int local_54;
  Llb_Prt_t *pLStack_50;
  int i;
  Llb_Prt_t *pPart2Best;
  Llb_Prt_t *pPart1Best;
  Llb_Prt_t *pPart;
  Llb_Var_t *pVarBest;
  Llb_Var_t *pVar;
  Llb_Prt_t **ppPart2_local;
  Llb_Prt_t **ppPart1_local;
  Llb_Mgr_t *p_local;
  
  pPart = (Llb_Prt_t *)0x0;
  pPart2Best = (Llb_Prt_t *)0x0;
  pLStack_50 = (Llb_Prt_t *)0x0;
  Llb_NonlinCheckVars(p);
  for (local_54 = 0; local_54 < p->nVars; local_54 = local_54 + 1) {
    pLVar3 = (Llb_Prt_t *)Llb_MgrVar(p,local_54);
    if ((pLVar3 != (Llb_Prt_t *)0x0) &&
       ((pPart == (Llb_Prt_t *)0x0 || (pLVar3->nSize < pPart->nSize)))) {
      pPart = pLVar3;
    }
  }
  if (pPart == (Llb_Prt_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    for (local_54 = 0; iVar2 = Vec_IntSize((Vec_Int_t *)pPart->bFunc), local_54 < iVar2;
        local_54 = local_54 + 1) {
      iVar2 = Vec_IntEntry((Vec_Int_t *)pPart->bFunc,local_54);
      pLVar4 = Llb_MgrPart(p,iVar2);
      pLVar3 = pLStack_50;
      pLVar1 = pLVar4;
      if ((((pPart2Best != (Llb_Prt_t *)0x0) &&
           (pLVar3 = pLVar4, pLVar1 = pPart2Best, pLStack_50 != (Llb_Prt_t *)0x0)) &&
          ((pLVar4->nSize < pPart2Best->nSize ||
           (pLVar3 = pLStack_50, pLVar4->nSize < pLStack_50->nSize)))) &&
         (pLVar3 = pLVar4, pLStack_50->nSize < pPart2Best->nSize)) {
        pLVar3 = pLStack_50;
        pLVar1 = pLVar4;
      }
      pPart2Best = pLVar1;
      pLStack_50 = pLVar3;
    }
    *ppPart1 = pPart2Best;
    *ppPart2 = pLStack_50;
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Llb_NonlinNextPartitions( Llb_Mgr_t * p, Llb_Prt_t ** ppPart1, Llb_Prt_t ** ppPart2 )
{
    Llb_Var_t * pVar, * pVarBest = NULL;
    Llb_Prt_t * pPart, * pPart1Best = NULL, * pPart2Best = NULL;
    int i;
    Llb_NonlinCheckVars( p );
    // find variable with minimum score
    Llb_MgrForEachVar( p, pVar, i )
        if ( pVarBest == NULL || pVarBest->nScore > pVar->nScore )
            pVarBest = pVar;
    if ( pVarBest == NULL )
        return 0;
    // find two partitions with minimum size
    Llb_VarForEachPart( p, pVarBest, pPart, i )
    {
        if ( pPart1Best == NULL )
            pPart1Best = pPart;
        else if ( pPart2Best == NULL )
            pPart2Best = pPart;
        else if ( pPart1Best->nSize > pPart->nSize || pPart2Best->nSize > pPart->nSize )
        {
            if ( pPart1Best->nSize > pPart2Best->nSize )
                pPart1Best = pPart;
            else
                pPart2Best = pPart;
        }
    }
    *ppPart1 = pPart1Best;
    *ppPart2 = pPart2Best;
    return 1; 
}